

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.cpp
# Opt level: O3

void ncnn::matmul_transb(Mat *A,Mat *B,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  void *pvVar4;
  ulong uVar5;
  ulong uVar6;
  bool *pbVar7;
  Mat *pMVar8;
  float fVar9;
  
  iVar1 = A->h;
  if (0 < (long)iVar1) {
    pvVar4 = A->data;
    uVar2 = A->w;
    lVar3 = 0;
    do {
      if (0 < (int)top_blob) {
        pbVar7 = &opt->lightmode + lVar3 * (int)top_blob * 4;
        uVar5 = 0;
        pMVar8 = B;
        do {
          fVar9 = 0.0;
          if (0 < (int)uVar2) {
            uVar6 = 0;
            do {
              fVar9 = fVar9 + *(float *)((long)&pMVar8->data + uVar6 * 4) *
                              *(float *)((long)pvVar4 + uVar6 * 4);
              uVar6 = uVar6 + 1;
            } while (uVar2 != uVar6);
          }
          *(float *)pbVar7 = fVar9;
          pbVar7 = pbVar7 + 4;
          uVar5 = uVar5 + 1;
          pMVar8 = (Mat *)((long)&pMVar8->data + (long)(int)uVar2 * 4);
        } while (uVar5 != ((ulong)top_blob & 0xffffffff));
      }
      lVar3 = lVar3 + 1;
      pvVar4 = (void *)((long)pvVar4 + (long)(int)uVar2 * 4);
    } while (lVar3 != iVar1);
  }
  return;
}

Assistant:

static void matmul_transb(const Mat& A, const Mat& B, Mat& top_blob, const Option& opt)
{
    const int M = A.h;
    const int K = A.w; // assert A.w == B.w
    const int N = B.h;

    const float* pA = A;
    const float* pB = B;
    float* pOut = top_blob;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int i = 0; i < M; i++)
    {
        const float* ptrA = pA + i * K;
        float* outptr = pOut + i * N;

        for (int j = 0; j < N; j++)
        {
            const float* ptrB = pB + j * K;

            float sum = 0.f;
            for (int k = 0; k < K; k++)
            {
                sum += ptrA[k] * ptrB[k];
            }

            *outptr++ = sum;
        }
    }
}